

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModel.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
CoreML::LinearModel::getOffsets
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,LinearModel *this)

{
  int iVar1;
  void *pvVar2;
  GLMRegressor *pGVar3;
  long lVar4;
  double n;
  value_type_conflict9 local_30;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pGVar3 = Specification::Model::_internal_mutable_glmregressor
                     ((this->super_Model).m_spec.
                      super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  pvVar2 = (pGVar3->offset_).arena_or_elements_;
  iVar1 = (pGVar3->offset_).current_size_;
  for (lVar4 = 0; (long)iVar1 * 8 != lVar4; lVar4 = lVar4 + 8) {
    local_30 = *(value_type_conflict9 *)((long)pvVar2 + lVar4);
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> LinearModel::getOffsets() {
        std::vector<double> result;
        auto lr = m_spec->mutable_glmregressor();
        for(double n : lr->offset()) {
            result.push_back(n);
        }
        return result;
    }